

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread_queue.c
# Opt level: O2

int pthread_queue_dequeue(pthread_queue_t *queue,void *buf,uint32_t timeout)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  uint uVar2;
  timespec *ts_00;
  timespec ts;
  
  if (queue == (pthread_queue_t *)0x0) {
    csp_print_func("csp not initialized\n");
  }
  else {
    if (timeout == 0xffffffff) {
      ts_00 = (timespec *)0x0;
    }
    else {
      ts_00 = &ts;
      iVar1 = get_deadline(ts_00,timeout);
      if (iVar1 != 0) {
        return -1;
      }
    }
    __mutex = &queue->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    do {
      if (queue->items != 0) {
        memcpy(buf,(void *)((long)queue->out * (long)queue->item_size + (long)queue->buffer),
               (long)queue->item_size);
        queue->items = queue->items + -1;
        queue->out = (queue->out + 1) % queue->size;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        pthread_cond_broadcast((pthread_cond_t *)&queue->cond_full);
        return 0;
      }
      if (ts_00 == (timespec *)0x0) {
        uVar2 = pthread_cond_wait((pthread_cond_t *)&queue->cond_empty,(pthread_mutex_t *)__mutex);
      }
      else {
        uVar2 = pthread_cond_timedwait
                          ((pthread_cond_t *)&queue->cond_empty,(pthread_mutex_t *)__mutex,
                           (timespec *)ts_00);
      }
    } while ((uVar2 & 0xfffffffb) == 0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return -1;
}

Assistant:

int pthread_queue_dequeue(pthread_queue_t * queue, void * buf, uint32_t timeout) {

	int ret;
	struct timespec ts;
	struct timespec * pts;

	if(!queue){
		csp_print("csp not initialized\n");
		return PTHREAD_QUEUE_ERROR;
	}

	/* Calculate timeout */
	if (timeout != CSP_MAX_TIMEOUT) {
		if (get_deadline(&ts, timeout) != 0) {
			return PTHREAD_QUEUE_ERROR;
		}
		pts = &ts;
	} else {
		pts = NULL;
	}

	/* Get queue lock */
	pthread_mutex_lock(&(queue->mutex));

	ret = wait_item_available(queue, pts);
	if (ret == PTHREAD_QUEUE_OK) {
		/* Coby object to output buffer */
		memcpy(buf, (char *)queue->buffer + (queue->out * queue->item_size), queue->item_size);
		queue->items--;
		queue->out = (queue->out + 1) % queue->size;
	}

	pthread_mutex_unlock(&(queue->mutex));

	if (ret == PTHREAD_QUEUE_OK) {
		/* Nofify blocked threads */
		pthread_cond_broadcast(&(queue->cond_full));
	}

	return ret;
}